

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O1

int run_test_getnameinfo_basic_ip6(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_a;
  long local_10;
  
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  local_10 = (long)iVar1;
  if (local_10 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(uVar2,&req,getnameinfo_req,&addr6,0);
    local_10 = (long)iVar1;
    if (local_10 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_10 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (local_10 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019da55;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_0019da55:
  plVar3 = &local_10;
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip6) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  
  int r;

  r = uv_ip6_addr(address_ip6, port, &addr6);
  ASSERT_OK(r);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr6,
                     0);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}